

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void map_spawn_chests(void *map_void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference psVar4;
  element_type *peVar5;
  reference pMVar6;
  reference pMVar7;
  list<Map_Chest_Spawn,std::allocator<Map_Chest_Spawn>> *this;
  reference __x;
  const_iterator __x_00;
  double dVar8;
  _List_const_iterator<Map_Chest_Spawn> local_120;
  reference local_118;
  Map_Chest_Spawn *spawn_1;
  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> slot_spawns;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
  *__range2_1;
  Map_Chest_Item item;
  iterator __end4;
  iterator __begin4;
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *__range4;
  undefined1 auStack_b0 [7];
  bool slot_used;
  Map_Chest_Spawn spawn;
  iterator __end2;
  iterator __begin2;
  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *__range2;
  undefined1 local_68 [8];
  vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
  spawns;
  undefined1 local_48 [7];
  bool needs_update;
  shared_ptr<Map_Chest> chest;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_> *__range1;
  double current_time;
  Map *map;
  void *map_void_local;
  
  dVar8 = Timer::GetTime();
  __end1 = std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::
           begin((vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_> *
                 )((long)map_void + 0x50));
  chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::end
                 ((vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                   *)((long)map_void + 0x50));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
                                     *)&chest.
                                        super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount), bVar1) {
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<Map_Chest>::shared_ptr((shared_ptr<Map_Chest> *)local_48,psVar4);
    spawns.
    super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::
    vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ::vector((vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
              *)local_68);
    peVar5 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_48);
    std::
    vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ::resize((vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
              *)local_68,(long)peVar5->slots);
    peVar5 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_48);
    __end2 = std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::begin
                       (&peVar5->spawns);
    spawn.last_taken =
         (double)std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::end
                           (&peVar5->spawns);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&spawn.last_taken), bVar1) {
      pMVar6 = std::_List_iterator<Map_Chest_Spawn>::operator*(&__end2);
      auStack_b0._0_4_ = pMVar6->spawnid;
      auStack_b0._4_2_ = (pMVar6->item).id;
      unique0x00012006 = *(undefined2 *)&(pMVar6->item).field_0x2;
      spawn._0_8_ = *(undefined8 *)&(pMVar6->item).amount;
      spawn.item._4_8_ = *(undefined8 *)&pMVar6->slot;
      spawn._16_8_ = pMVar6->last_taken;
      if ((double)(int)(short)spawn.item.slot * 60.0 + (double)spawn._16_8_ < dVar8) {
        bVar1 = false;
        peVar5 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        __end4 = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::begin
                           (&peVar5->items);
        item._4_8_ = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::end
                               (&peVar5->items);
        while (bVar2 = std::operator!=(&__end4,(_Self *)&item.amount), bVar2) {
          pMVar7 = std::_List_iterator<Map_Chest_Item>::operator*(&__end4);
          item._0_4_ = pMVar7->slot;
          if (item._0_4_ == spawn.item.amount) {
            bVar1 = true;
          }
          std::_List_iterator<Map_Chest_Item>::operator++(&__end4);
        }
        if (!bVar1) {
          this = (list<Map_Chest_Spawn,std::allocator<Map_Chest_Spawn>> *)
                 std::
                 vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                 ::operator[]((vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                               *)local_68,(long)(spawn.item.amount + -1));
          std::__cxx11::list<Map_Chest_Spawn,std::allocator<Map_Chest_Spawn>>::
          emplace_back<Map_Chest_Spawn_const&>(this,(Map_Chest_Spawn *)auStack_b0);
        }
      }
      std::_List_iterator<Map_Chest_Spawn>::operator++(&__end2);
    }
    __end2_1 = std::
               vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
               ::begin((vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                        *)local_68);
    slot_spawns.super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>._M_impl._M_node.
    _M_size = (size_t)std::
                      vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                      ::end((vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                             *)local_68);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_*,_std::vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>_>
                               *)&slot_spawns.
                                  super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                  ._M_impl._M_node._M_size), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_*,_std::vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>_>
            ::operator*(&__end2_1);
      std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::list
                ((list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&spawn_1,__x);
      bVar1 = std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::empty
                        ((list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&spawn_1);
      if (!bVar1) {
        __x_00 = std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::cbegin
                           ((list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&spawn_1);
        std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::size
                  ((list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&spawn_1);
        iVar3 = util::rand();
        local_120 = std::next<std::_List_const_iterator<Map_Chest_Spawn>>
                              (__x_00._M_node,(long)iVar3);
        local_118 = std::_List_const_iterator<Map_Chest_Spawn>::operator*(&local_120);
        peVar5 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        Map_Chest::AddItem(peVar5,(local_118->item).id,(local_118->item).amount,local_118->slot);
        spawns.
        super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      }
      std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::~list
                ((list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&spawn_1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_*,_std::vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>_>
      ::operator++(&__end2_1);
    }
    if ((spawns.
         super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      peVar5 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      Map_Chest::Update(peVar5,(Map *)map_void,(Character *)0x0);
    }
    std::
    vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ::~vector((vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
               *)local_68);
    std::shared_ptr<Map_Chest>::~shared_ptr((shared_ptr<Map_Chest> *)local_48);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void map_spawn_chests(void *map_void)
{
	Map *map(static_cast<Map *>(map_void));

	double current_time = Timer::GetTime();
	UTIL_FOREACH(map->chests, chest)
	{
		bool needs_update = false;

		std::vector<std::list<Map_Chest_Spawn>> spawns;
		spawns.resize(chest->slots);

		UTIL_FOREACH(chest->spawns, spawn)
		{
			if (spawn.last_taken + spawn.time*60.0 < current_time)
			{
				bool slot_used = false;

				UTIL_FOREACH(chest->items, item)
				{
					if (item.slot == spawn.slot)
					{
						slot_used = true;
					}
				}

				if (!slot_used)
				{
					spawns[spawn.slot - 1].emplace_back(spawn);
				}
			}
		}

		UTIL_FOREACH(spawns, slot_spawns)
		{
			if (!slot_spawns.empty())
			{
				const Map_Chest_Spawn& spawn = *std::next(slot_spawns.cbegin(), util::rand(0, slot_spawns.size() - 1));

				chest->AddItem(spawn.item.id, spawn.item.amount, spawn.slot);
				needs_update = true;

#ifdef DEBUG
				Console::Dbg("Spawning chest item %i (x%i) on map %i", spawn.item.id, spawn.item.amount, map->id);
#endif // DEBUG
			}
		}

		if (needs_update)
		{
			chest->Update(map, 0);
		}
	}
}